

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdpeer.cc
# Opt level: O3

int __thiscall bdSpace::scanOutOfDatePeers(bdSpace *this,list<bdId,_std::allocator<bdId>_> *peerIds)

{
  size_t *psVar1;
  uint32_t uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  size_t sVar5;
  uint32_t uVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  long lVar9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  map<bdMetric,_bdId,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>
  closest;
  _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdId>,_std::_Select1st<std::pair<const_bdMetric,_bdId>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>
  local_60;
  
  uVar2 = this->mAttachedCount;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  uVar6 = 0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = (_List_node_base *)time((time_t *)0x0);
  p_Var12 = (_List_node_base *)
            (this->buckets).super__Vector_base<bdBucket,_std::allocator<bdBucket>_>._M_impl.
            super__Vector_impl_data._M_start;
  p_Var10 = (_List_node_base *)
            (this->buckets).super__Vector_base<bdBucket,_std::allocator<bdBucket>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (p_Var12 != p_Var10) {
    uVar6 = 0;
    do {
      p_Var11 = p_Var12->_M_next;
      if (p_Var12->_M_next != p_Var12) {
        do {
          if ((uVar2 == 0) ||
             ((*(byte *)&((list<bdPeer,_std::allocator<bdPeer>_> *)(p_Var11 + 5))->
                         super__List_base<bdPeer,_std::allocator<bdPeer>_> & 2) == 0)) {
LAB_0010f90f:
            if ((300 < (long)p_Var7 -
                       (long)*(_List_node_base **)
                              &((list<bdPeer,_std::allocator<bdPeer>_> *)((long)(p_Var11 + 3) + 8))
                               ->super__List_base<bdPeer,_std::allocator<bdPeer>_>) &&
               ((300 < (long)((long)p_Var7 -
                             *(size_t *)
                              &((list<bdPeer,_std::allocator<bdPeer>_> *)(p_Var11 + 4))->
                               super__List_base<bdPeer,_std::allocator<bdPeer>_>) ||
                (((ulong)(((list<bdPeer,_std::allocator<bdPeer>_> *)&p_Var11[3]._M_next)->
                         super__List_base<bdPeer,_std::allocator<bdPeer>_>)._M_impl._M_node.
                         super__List_node_base._M_next & 0x200000000) == 0)))) {
              p_Var8 = (_List_node_base *)operator_new(0x38);
              *(undefined4 *)&p_Var8[3]._M_next =
                   *(undefined4 *)
                    &(((list<bdPeer,_std::allocator<bdPeer>_> *)&p_Var11[3]._M_next)->
                     super__List_base<bdPeer,_std::allocator<bdPeer>_>)._M_impl._M_node.
                     super__List_node_base._M_next;
              p_Var10 = *(_List_node_base **)
                         &((list<bdPeer,_std::allocator<bdPeer>_> *)(p_Var11 + 1))->
                          super__List_base<bdPeer,_std::allocator<bdPeer>_>;
              p_Var3 = *(_List_node_base **)((long)(p_Var11 + 1) + 8);
              p_Var4 = *(_List_node_base **)
                        &((list<bdPeer,_std::allocator<bdPeer>_> *)((long)(p_Var11 + 2) + 8))->
                         super__List_base<bdPeer,_std::allocator<bdPeer>_>;
              p_Var8[2]._M_next =
                   *(_List_node_base **)
                    &((list<bdPeer,_std::allocator<bdPeer>_> *)(p_Var11 + 2))->
                     super__List_base<bdPeer,_std::allocator<bdPeer>_>;
              p_Var8[2]._M_prev = p_Var4;
              p_Var8[1]._M_next = p_Var10;
              p_Var8[1]._M_prev = p_Var3;
              std::__detail::_List_node_base::_M_hook(p_Var8);
              psVar1 = &(peerIds->super__List_base<bdId,_std::allocator<bdId>_>)._M_impl._M_node.
                        _M_size;
              *psVar1 = *psVar1 + 1;
              *(_List_node_base **)
               &((list<bdPeer,_std::allocator<bdPeer>_> *)((long)(p_Var11 + 3) + 8))->
                super__List_base<bdPeer,_std::allocator<bdPeer>_> = p_Var7;
            }
          }
          else {
            if (((long)p_Var7 -
                 (long)*(_List_node_base **)
                        &((list<bdPeer,_std::allocator<bdPeer>_> *)((long)(p_Var11 + 3) + 8))->
                         super__List_base<bdPeer,_std::allocator<bdPeer>_> < 0x12) ||
               ((long)((long)p_Var7 -
                      *(size_t *)
                       &((list<bdPeer,_std::allocator<bdPeer>_> *)(p_Var11 + 4))->
                        super__List_base<bdPeer,_std::allocator<bdPeer>_>) < 0x12)) {
              uVar6 = uVar6 + 1;
              goto LAB_0010f90f;
            }
            p_Var8 = (_List_node_base *)operator_new(0x38);
            *(undefined4 *)&p_Var8[3]._M_next =
                 *(undefined4 *)
                  &(((list<bdPeer,_std::allocator<bdPeer>_> *)&p_Var11[3]._M_next)->
                   super__List_base<bdPeer,_std::allocator<bdPeer>_>)._M_impl._M_node.
                   super__List_node_base._M_next;
            p_Var10 = *(_List_node_base **)
                       &((list<bdPeer,_std::allocator<bdPeer>_> *)(p_Var11 + 1))->
                        super__List_base<bdPeer,_std::allocator<bdPeer>_>;
            p_Var3 = *(_List_node_base **)((long)(p_Var11 + 1) + 8);
            p_Var4 = *(_List_node_base **)
                      &((list<bdPeer,_std::allocator<bdPeer>_> *)((long)(p_Var11 + 2) + 8))->
                       super__List_base<bdPeer,_std::allocator<bdPeer>_>;
            p_Var8[2]._M_next =
                 *(_List_node_base **)
                  &((list<bdPeer,_std::allocator<bdPeer>_> *)(p_Var11 + 2))->
                   super__List_base<bdPeer,_std::allocator<bdPeer>_>;
            p_Var8[2]._M_prev = p_Var4;
            p_Var8[1]._M_next = p_Var10;
            p_Var8[1]._M_prev = p_Var3;
            std::__detail::_List_node_base::_M_hook(p_Var8);
            psVar1 = &(peerIds->super__List_base<bdId,_std::allocator<bdId>_>)._M_impl._M_node.
                      _M_size;
            *psVar1 = *psVar1 + 1;
            *(_List_node_base **)
             &((list<bdPeer,_std::allocator<bdPeer>_> *)((long)(p_Var11 + 3) + 8))->
              super__List_base<bdPeer,_std::allocator<bdPeer>_> = p_Var7;
            uVar6 = uVar6 + 1;
          }
          lVar9 = (long)p_Var7 -
                  *(size_t *)
                   &((list<bdPeer,_std::allocator<bdPeer>_> *)(p_Var11 + 4))->
                    super__List_base<bdPeer,_std::allocator<bdPeer>_>;
          if ((long)p_Var7 - (long)*(_List_node_base **)((long)(p_Var11 + 4) + 8) < 0x10) {
            if (0x267 < lVar9) goto LAB_0010f9a9;
LAB_0010f99b:
            p_Var10 = (((list<bdPeer,_std::allocator<bdPeer>_> *)&p_Var11->_M_next)->
                      super__List_base<bdPeer,_std::allocator<bdPeer>_>)._M_impl._M_node.
                      super__List_node_base._M_next;
          }
          else {
            if (((ulong)(((list<bdPeer,_std::allocator<bdPeer>_> *)&p_Var11[3]._M_next)->
                        super__List_base<bdPeer,_std::allocator<bdPeer>_>)._M_impl._M_node.
                        super__List_node_base._M_next & 0x200000000) != 0 && lVar9 < 0x268)
            goto LAB_0010f99b;
LAB_0010f9a9:
            p_Var10 = p_Var11->_M_next;
            *(long *)(p_Var12 + 1) = *(long *)(p_Var12 + 1) + -1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(p_Var11,0x58);
          }
          p_Var11 = p_Var10;
        } while (p_Var10 != p_Var12);
        p_Var10 = (_List_node_base *)
                  (this->buckets).super__Vector_base<bdBucket,_std::allocator<bdBucket>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      p_Var12 = (_List_node_base *)((long)(p_Var12 + 1) + 8);
    } while (p_Var12 != p_Var10);
  }
  if ((600 < (long)p_Var7 - this->mAttachTS) || (uVar6 != this->mAttachedCount)) {
    updateAttachedPeers(this);
    this->mAttachTS = (time_t)p_Var7;
  }
  sVar5 = (peerIds->super__List_base<bdId,_std::allocator<bdId>_>)._M_impl._M_node._M_size;
  std::
  _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdId>,_std::_Select1st<std::pair<const_bdMetric,_bdId>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdId>_>_>
  ::~_Rb_tree(&local_60);
  return (int)sVar5;
}

Assistant:

int	bdSpace::scanOutOfDatePeers(std::list<bdId> &peerIds) {
	/* 
	 * 
	 */
	bool doAttached = (mAttachedCount > 0);
	uint32_t attachedCount = 0;

	std::map<bdMetric, bdId> closest;
	std::map<bdMetric, bdId>::iterator mit;

	std::vector<bdBucket>::iterator it;
	std::list<bdPeer>::iterator eit;
	time_t ts = time(NULL);

	/* iterate through the buckets, and sort by distance */
	for (it = buckets.begin(); it != buckets.end(); it++) {
		for (eit = it->entries.begin(); eit != it->entries.end(); )
		{
			bool added = false;
			if (doAttached) {
				if (eit->mExtraFlags & BITDHT_PEER_EXFLAG_ATTACHED) {
					/* add to send list, if we haven't pinged recently */
					if ((ts - eit->mLastSendTime > BITDHT_ATTACHED_SEND_PERIOD ) &&
						(ts - eit->mLastRecvTime > BITDHT_ATTACHED_SEND_PERIOD )) {
						peerIds.push_back(eit->mPeerId);
						eit->mLastSendTime = ts;
						added = true;
					}
					attachedCount++;
				}
			}
				

			/* timeout on last send time! */
			if ((!added) && (ts - eit->mLastSendTime > BITDHT_MAX_SEND_PERIOD )) {
				/* We want to ping a peer iff:
		 	 	 * 1) They are out-of-date: mLastRecvTime is too old.
			 	 * 2) They don't have 0x0001 flag (we haven't received a PONG) and never sent.
			 	 */
				if ((ts - eit->mLastRecvTime > BITDHT_MAX_SEND_PERIOD ) || 
					!(eit->mPeerFlags & BITDHT_PEER_STATUS_RECV_PONG)) {
					peerIds.push_back(eit->mPeerId);
					eit->mLastSendTime = ts;
				}
			}


			/* we also want to remove very old entries (should it happen here?) 
			 * which are not pushed out by newer entries (will happen in for closer buckets)
			 */

			bool discard = false;
			/* discard very old entries */
			if (ts - eit->mLastRecvTime > BITDHT_DISCARD_PERIOD) {
				discard = true;
			}
		
			/* discard peers which have not responded to anything (ie have no flags set) */
			/* changed into have not id'ed themselves, as we've added ping to list of flags. */
			if ((ts - eit->mFoundTime > BITDHT_MAX_RESPONSE_PERIOD ) &&
				!(eit->mPeerFlags & BITDHT_PEER_STATUS_RECV_PONG)) {
				discard = true;
			}
			

			/* INCREMENT */
			if (discard) {
				eit = it->entries.erase(eit);
			}
			else
			{
				eit++;
			}
		}
	}

#define ATTACH_UPDATE_PERIOD	600

	if ((ts - mAttachTS > ATTACH_UPDATE_PERIOD) || (attachedCount != mAttachedCount)) {
		//std::cerr << "Updating ATTACH Stuff";
		//std::cerr << std::endl;
		updateAttachedPeers(); /* XXX TEMP HACK to look at stability */
		mAttachTS = ts;
	}

	return (peerIds.size());
}